

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.h
# Opt level: O1

map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
ConfigManager::
Reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ReadConfigurations(map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *__return_storage_ptr__,
                  Reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *this)

{
  _Rb_tree_header *p_Var1;
  Logger *this_00;
  char *what;
  undefined1 local_58 [56];
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  (*this->m_config_behavior->_vptr_IReadConfig[2])(local_58);
  std::
  _Rb_tree<ConfigManager::Enums::Configurations,_std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&__return_storage_ptr__->_M_t,
              (_Rb_tree<ConfigManager::Enums::Configurations,_std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_58);
  std::
  _Rb_tree<ConfigManager::Enums::Configurations,_std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<ConfigManager::Enums::Configurations,_std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_58);
  this_00 = this->m_logger;
  LogManager::Interfaces::ILogger<std::shared_ptr<spdlog::logger>>::GetLogMessage<char_const[19]>
            ((string *)local_58,this_00,"[%s] - Configuration successfuly readed",
             (char (*) [19])"ReadConfigurations");
  (*(this_00->super_ILogger<std::shared_ptr<spdlog::logger>_>)._vptr_ILogger[2])(this_00,local_58);
  if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_58._16_8_ + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

const std::map<Enums::Configurations, T> ReadConfigurations() override
        {
            auto result = std::map<Enums::Configurations, T>();

            try
            {
                result = m_config_behavior->ReadConfigurations();

                m_logger->LogInfo(
                            m_logger->GetLogMessage(
                                "[%s] - Configuration successfuly readed", __func__));
            }
            catch (std::exception& e)
            {
                char* what;
                strcpy(what, e.what());
                m_logger->LogError(m_logger->GetLogMessage("[%s] - %s", __func__, what));
            }
            catch(...)
            {
                m_logger->LogError(m_logger->GetLogMessage("[%s] - Unknown error", __func__));
            }

            return result;
        }